

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O0

void __thiscall
chrono::ChLoaderGravity::ChLoaderGravity
          (ChLoaderGravity *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  shared_ptr<chrono::ChLoadableUVW> local_28;
  shared_ptr<chrono::ChLoadableUVW> *local_18;
  shared_ptr<chrono::ChLoadableUVW> *mloadable_local;
  ChLoaderGravity *this_local;
  
  local_18 = mloadable;
  mloadable_local = (shared_ptr<chrono::ChLoadableUVW> *)this;
  std::shared_ptr<chrono::ChLoadableUVW>::shared_ptr(&local_28,mloadable);
  ChLoaderUVWdistributed::ChLoaderUVWdistributed(&this->super_ChLoaderUVWdistributed,&local_28);
  std::shared_ptr<chrono::ChLoadableUVW>::~shared_ptr(&local_28);
  (this->super_ChLoaderUVWdistributed).super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderGravity_001c3fb8;
  ChVector<double>::ChVector(&this->G_acc,0.0,-9.8,0.0);
  this->num_int_points = 1;
  return;
}

Assistant:

ChLoaderGravity(std::shared_ptr<ChLoadableUVW> mloadable)
        : ChLoaderUVWdistributed(mloadable), G_acc(0, -9.8, 0), num_int_points(1){}